

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_InitUndeclRootLetProperty(Var obj,PropertyId propertyId)

{
  undefined8 uVar1;
  ScriptContext *this;
  ThreadContext *threadContext;
  JavascriptLibrary *this_00;
  Var pvVar2;
  undefined1 local_40 [3];
  PropertyAttributes attributes;
  PropertyOperationFlags flags;
  JsReentLock reentrancylock;
  RecyclableObject *instance;
  PropertyId propertyId_local;
  Var obj_local;
  
  reentrancylock._24_8_ = VarTo<Js::RecyclableObject>(obj);
  this = RecyclableObject::GetScriptContext((RecyclableObject *)reentrancylock._24_8_);
  threadContext = ScriptContext::GetThreadContext(this);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  uVar1 = reentrancylock._24_8_;
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)reentrancylock._24_8_);
  pvVar2 = JavascriptLibrary::GetUndeclBlockVar(this_00);
  (**(code **)(*(long *)uVar1 + 0xf0))(uVar1,propertyId,pvVar2,0x57,0,0x90,0xf);
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return 1;
}

Assistant:

BOOL JavascriptOperators::OP_InitUndeclRootLetProperty(Var obj, PropertyId propertyId)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(obj);
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_InitUndeclRootLetFld, reentrancylock, instance->GetScriptContext()->GetThreadContext());

        PropertyOperationFlags flags = static_cast<PropertyOperationFlags>(PropertyOperation_SpecialValue | PropertyOperation_AllowUndecl);
        PropertyAttributes attributes = PropertyLetDefaults | PropertyLetConstGlobal;

        instance->SetPropertyWithAttributes(propertyId, instance->GetLibrary()->GetUndeclBlockVar(), attributes, NULL, flags);

        return TRUE;
        JIT_HELPER_END(Op_InitUndeclRootLetFld);
    }